

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

cmExternalMakefileProjectGeneratorFactory * cmExtraEclipseCDT4Generator::GetFactory(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  int iVar3;
  string local_58;
  string local_38;
  
  if (GetFactory()::factory == '\0') {
    iVar3 = __cxa_guard_acquire(&GetFactory()::factory);
    if (iVar3 != 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Eclipse CDT4","");
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Generates Eclipse CDT 4.0 project files (deprecated).","");
      cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraEclipseCDT4Generator>::
      cmExternalMakefileProjectGeneratorSimpleFactory(&GetFactory::factory,&local_58,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(cmExternalMakefileProjectGeneratorFactory::
                   ~cmExternalMakefileProjectGeneratorFactory,&GetFactory::factory,&__dso_handle);
      __cxa_guard_release(&GetFactory()::factory);
    }
  }
  cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58,&GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory);
  _Var2._M_p = local_58._M_dataplus._M_p;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  if (_Var2._M_p == (pointer)local_58._M_string_length) {
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Ninja","");
    cmExternalMakefileProjectGeneratorFactory::AddSupportedGlobalGenerator
              (&GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unix Makefiles","");
    cmExternalMakefileProjectGeneratorFactory::AddSupportedGlobalGenerator
              (&GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return &GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory;
}

Assistant:

cmExternalMakefileProjectGeneratorFactory*
cmExtraEclipseCDT4Generator::GetFactory()
{
  static cmExternalMakefileProjectGeneratorSimpleFactory<
    cmExtraEclipseCDT4Generator>
    factory("Eclipse CDT4",
            "Generates Eclipse CDT 4.0 project files (deprecated).");

  if (factory.GetSupportedGlobalGenerators().empty()) {
// TODO: Verify if __CYGWIN__ should be checked.
// #if defined(_WIN32) && !defined(__CYGWIN__)
#if defined(_WIN32)
    factory.AddSupportedGlobalGenerator("NMake Makefiles");
    factory.AddSupportedGlobalGenerator("MinGW Makefiles");
// factory.AddSupportedGlobalGenerator("MSYS Makefiles");
#endif
    factory.AddSupportedGlobalGenerator("Ninja");
    factory.AddSupportedGlobalGenerator("Unix Makefiles");
  }

  return &factory;
}